

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderTestparseWithStackLimit::runTestCase(TestCharReaderTestparseWithStackLimit *this)

{
  TestResult *result;
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  CharReader *pCVar4;
  string errs;
  char doc [25];
  Value root;
  CharReaderBuilder b;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  Json::Value::Value(&root,nullValue);
  builtin_strncpy(doc + 0x10,"value\" }",9);
  builtin_strncpy(doc,"{ \"property\" : \"",0x10);
  Json::Value::Value(&local_58,2);
  pVVar3 = Json::Value::operator[](&b.settings_,"stackLimit");
  Json::Value::operator=(pVVar3,&local_58);
  Json::Value::~Value(&local_58);
  pCVar4 = Json::CharReaderBuilder::newCharReader(&b);
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  iVar2 = (*pCVar4->_vptr_CharReader[2])(pCVar4,doc,doc + 0x18,&root,&errs);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x74f,"ok");
  }
  bVar1 = std::operator==(&errs,"");
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x750,"errs == \"\"");
  }
  result = (this->super_CharReaderTest).super_TestCase.result_;
  pVVar3 = Json::Value::operator[](&root,"property");
  Json::Value::Value(&local_80,pVVar3);
  JsonTest::checkEqual<char_const*,Json::Value>
            (result,"value",&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x751,"\"value\" == root[\"property\"]");
  Json::Value::~Value(&local_80);
  (*pCVar4->_vptr_CharReader[1])(pCVar4);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::Value(&local_a8,1);
  pVVar3 = Json::Value::operator[](&b.settings_,"stackLimit");
  Json::Value::operator=(pVVar3,&local_a8);
  Json::Value::~Value(&local_a8);
  pCVar4 = Json::CharReaderBuilder::newCharReader(&b);
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  (*pCVar4->_vptr_CharReader[2])(pCVar4,doc,doc + 0x18,&root);
  JsonTest::TestResult::addFailure
            ((this->super_CharReaderTest).super_TestCase.result_,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x75a,
             "expected exception thrown: reader->parse( doc, doc + std::strlen(doc), &root, &errs)")
  ;
  (*pCVar4->_vptr_CharReader[1])(pCVar4);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::~Value(&root);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithStackLimit) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "{ \"property\" : \"value\" }";
  {
  b.settings_["stackLimit"] = 2;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs == "");
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
  {
  b.settings_["stackLimit"] = 1;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  JSONTEST_ASSERT_THROWS(reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs));
  delete reader;
  }
}